

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

GlobalSet * __thiscall MixedArena::alloc<wasm::GlobalSet>(MixedArena *this)

{
  GlobalSet *pGVar1;
  
  pGVar1 = (GlobalSet *)allocSpace(this,0x28,8);
  (pGVar1->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id = GlobalSetId;
  (pGVar1->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
  (pGVar1->name).super_IString.str._M_len = 0;
  (pGVar1->name).super_IString.str._M_str = (char *)0x0;
  return pGVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }